

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O3

gzFile gz_open(char *path,char *mode,int fd)

{
  char cVar1;
  char cVar2;
  int iVar3;
  gz_stream *s;
  uLong uVar4;
  size_t sVar5;
  char *__dest;
  Byte *pBVar6;
  int *piVar7;
  FILE *__stream;
  long lVar8;
  uint level;
  char fmode [80];
  
  if (mode == (char *)0x0 || path == (char *)0x0) {
    return (gzFile)0x0;
  }
  s = (gz_stream *)malloc(0xd0);
  if (s == (gz_stream *)0x0) {
    return (gzFile)0x0;
  }
  (s->stream).next_in = (Bytef *)0x0;
  (s->stream).next_out = (Bytef *)0x0;
  (s->stream).avail_out = 0;
  (s->stream).avail_in = 0;
  (s->stream).zalloc = (alloc_func)0x0;
  (s->stream).zfree = (free_func)0x0;
  (s->stream).opaque = (voidpf)0x0;
  s->z_err = 0;
  s->z_eof = 0;
  s->file = (FILE *)0x0;
  s->inbuf = (Byte *)0x0;
  s->outbuf = (Byte *)0x0;
  s->in = 0;
  s->out = 0;
  s->back = -1;
  uVar4 = cm_zlib_crc32(0,(uchar *)0x0,0);
  s->crc = uVar4;
  s->msg = (char *)0x0;
  s->transparent = 0;
  sVar5 = strlen(path);
  __dest = (char *)malloc(sVar5 + 1);
  s->path = __dest;
  if (__dest == (char *)0x0) goto LAB_0057c0ce;
  strcpy(__dest,path);
  s->mode = '\0';
  cVar2 = '\0';
  level = 0xffffffff;
  iVar3 = 0;
  lVar8 = 0;
  do {
    cVar1 = *mode;
    if ((cVar1 == 'a') || (cVar1 == 'w')) {
      s->mode = 'w';
      cVar2 = 'w';
LAB_0057bf60:
      if (cVar1 == 'R') {
        iVar3 = 3;
      }
      else if (cVar1 == 'f') {
        iVar3 = 1;
      }
      else {
        if (cVar1 != 'h') goto LAB_0057bf77;
        iVar3 = 2;
      }
    }
    else if (cVar1 == 'r') {
      s->mode = 'r';
      cVar2 = 'r';
LAB_0057bf77:
      fmode[lVar8] = cVar1;
      lVar8 = lVar8 + 1;
    }
    else {
      if (9 < (byte)(cVar1 - 0x30U)) goto LAB_0057bf60;
      level = (uint)(byte)(cVar1 - 0x30U);
    }
  } while ((cVar1 != '\0') && (mode = mode + 1, lVar8 != 0x50));
  if (cVar2 == 'w') {
    iVar3 = cm_zlib_deflateInit2_((z_streamp_conflict)s,level,8,-0xf,8,iVar3,"1.2.3",0x70);
    pBVar6 = (Byte *)malloc(0x4000);
    s->outbuf = pBVar6;
    (s->stream).next_out = pBVar6;
    if (iVar3 != 0 || pBVar6 == (Byte *)0x0) goto LAB_0057c0ce;
  }
  else {
    if (cVar2 == '\0') goto LAB_0057c0ce;
    pBVar6 = (Byte *)malloc(0x4000);
    s->inbuf = pBVar6;
    (s->stream).next_in = pBVar6;
    iVar3 = cm_zlib_inflateInit2_((z_streamp)s,-0xf,"1.2.3",0x70);
    if ((iVar3 != 0) || (s->inbuf == (Byte *)0x0)) goto LAB_0057c0ce;
  }
  (s->stream).avail_out = 0x4000;
  piVar7 = __errno_location();
  *piVar7 = 0;
  if (fd < 0) {
    __stream = fopen(path,fmode);
  }
  else {
    __stream = fdopen(fd,fmode);
  }
  s->file = (FILE *)__stream;
  if (__stream != (FILE *)0x0) {
    if (s->mode != 'w') {
      check_header(s);
      lVar8 = ftell((FILE *)s->file);
      s->start = lVar8 - (ulong)(s->stream).avail_in;
      return s;
    }
    fprintf(__stream,"%c%c%c%c%c%c%c%c%c%c",0x1f,0x8b,8,0,0,0,0,0,0,3);
    s->start = 10;
    return s;
  }
LAB_0057c0ce:
  destroy(s);
  return (gzFile)0x0;
}

Assistant:

local gzFile gz_open (path, mode, fd)
    const char *path;
    const char *mode;
    int  fd;
{
    int err;
    int level = Z_DEFAULT_COMPRESSION; /* compression level */
    int strategy = Z_DEFAULT_STRATEGY; /* compression strategy */
    char *p = (char*)mode;
    gz_stream *s;
    char fmode[80]; /* copy of mode, without the compression level */
    char *m = fmode;

    if (!path || !mode) return Z_NULL;

    s = (gz_stream *)ALLOC(sizeof(gz_stream));
    if (!s) return Z_NULL;

    s->stream.zalloc = (alloc_func)0;
    s->stream.zfree = (free_func)0;
    s->stream.opaque = (voidpf)0;
    s->stream.next_in = s->inbuf = Z_NULL;
    s->stream.next_out = s->outbuf = Z_NULL;
    s->stream.avail_in = s->stream.avail_out = 0;
    s->file = NULL;
    s->z_err = Z_OK;
    s->z_eof = 0;
    s->in = 0;
    s->out = 0;
    s->back = EOF;
    s->crc = crc32(0L, Z_NULL, 0);
    s->msg = NULL;
    s->transparent = 0;

    s->path = (char*)ALLOC(strlen(path)+1);
    if (s->path == NULL) {
        return destroy(s), (gzFile)Z_NULL;
    }
    strcpy(s->path, path); /* do this early for debugging */

    s->mode = '\0';
    do {
        if (*p == 'r') s->mode = 'r';
        if (*p == 'w' || *p == 'a') s->mode = 'w';
        if (*p >= '0' && *p <= '9') {
            level = *p - '0';
        } else if (*p == 'f') {
          strategy = Z_FILTERED;
        } else if (*p == 'h') {
          strategy = Z_HUFFMAN_ONLY;
        } else if (*p == 'R') {
          strategy = Z_RLE;
        } else {
            *m++ = *p; /* copy the mode */
        }
    } while (*p++ && m != fmode + sizeof(fmode));
    if (s->mode == '\0') return destroy(s), (gzFile)Z_NULL;

    if (s->mode == 'w') {
#ifdef NO_GZCOMPRESS
        err = Z_STREAM_ERROR;
#else
        err = deflateInit2(&(s->stream), level,
                           Z_DEFLATED, -MAX_WBITS, DEF_MEM_LEVEL, strategy);
        /* windowBits is passed < 0 to suppress zlib header */

        s->stream.next_out = s->outbuf = (Byte*)ALLOC(Z_BUFSIZE);
#endif
        if (err != Z_OK || s->outbuf == Z_NULL) {
            return destroy(s), (gzFile)Z_NULL;
        }
    } else {
        s->stream.next_in  = s->inbuf = (Byte*)ALLOC(Z_BUFSIZE);

        err = inflateInit2(&(s->stream), -MAX_WBITS);
        /* windowBits is passed < 0 to tell that there is no zlib header.
         * Note that in this case inflate *requires* an extra "dummy" byte
         * after the compressed stream in order to complete decompression and
         * return Z_STREAM_END. Here the gzip CRC32 ensures that 4 bytes are
         * present after the compressed stream.
         */
        if (err != Z_OK || s->inbuf == Z_NULL) {
            return destroy(s), (gzFile)Z_NULL;
        }
    }
    s->stream.avail_out = Z_BUFSIZE;

    errno = 0;
    s->file = fd < 0 ? F_OPEN(path, fmode) : (FILE*)fdopen(fd, fmode);

    if (s->file == NULL) {
        return destroy(s), (gzFile)Z_NULL;
    }
    if (s->mode == 'w') {
        /* Write a very simple .gz header:
         */
        fprintf(s->file, "%c%c%c%c%c%c%c%c%c%c", gz_magic[0], gz_magic[1],
             Z_DEFLATED, 0 /*flags*/, 0,0,0,0 /*time*/, 0 /*xflags*/, OS_CODE);
        s->start = 10L;
        /* We use 10L instead of ftell(s->file) to because ftell causes an
         * fflush on some systems. This version of the library doesn't use
         * start anyway in write mode, so this initialization is not
         * necessary.
         */
    } else {
        check_header(s); /* skip the .gz header */
        s->start = ftell(s->file) - s->stream.avail_in;
    }

    return (gzFile)s;
}